

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_relocate(Tree *this,substr next_arena)

{
  pfn_error p_Var1;
  NodeData *pNVar2;
  size_t sVar3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  long lVar8;
  csubstr cVar9;
  substr sVar10;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  csubstr s_02;
  csubstr s_03;
  csubstr s_04;
  csubstr s_05;
  csubstr s_06;
  csubstr s_07;
  csubstr s_08;
  csubstr s_09;
  csubstr s_10;
  csubstr s_11;
  csubstr s_12;
  csubstr s_13;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char msg [39];
  
  if (next_arena.len == 0 || next_arena.str == (char *)0x0) {
    builtin_strncpy(msg,"check failed: (next_arena.not_empty())",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_70 = cVar9.len;
    pcStack_78 = cVar9.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x630b) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x630b) << 0x40,8);
    LVar5.name.str = pcStack_78;
    LVar5.name.len = local_70;
    (*p_Var1)(msg,0x27,LVar5,(this->m_callbacks).m_user_data);
  }
  if (next_arena.len < (this->m_arena).len) {
    builtin_strncpy(msg + 0x10,"ext_arena.len >= m_aren",0x17);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_98 = cVar9.len;
    pcStack_a0 = cVar9.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x630c) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x630c) << 0x40,8);
    LVar6.name.str = pcStack_a0;
    LVar6.name.len = local_98;
    (*p_Var1)(msg,0x2e,LVar6,(this->m_callbacks).m_user_data);
  }
  memcpy(next_arena.str,(this->m_arena).str,this->m_arena_pos);
  pNVar2 = this->m_buf;
  sVar3 = this->m_cap;
  for (lVar8 = 0; sVar3 * 0x90 - lVar8 != 0; lVar8 = lVar8 + 0x90) {
    s.len = *(size_t *)((long)&(pNVar2->m_key).scalar.len + lVar8);
    s.str = *(char **)((long)&(pNVar2->m_key).scalar.str + lVar8);
    bVar7 = in_arena(this,s);
    if (bVar7) {
      s_00.len = *(size_t *)((long)&(pNVar2->m_key).scalar.len + lVar8);
      s_00.str = *(char **)((long)&(pNVar2->m_key).scalar.str + lVar8);
      sVar10 = _relocated(this,s_00,next_arena);
      *(char **)((long)&(pNVar2->m_key).scalar.str + lVar8) = sVar10.str;
      *(size_t *)((long)&(pNVar2->m_key).scalar.len + lVar8) = sVar10.len;
    }
    s_01.len = *(size_t *)((long)&(pNVar2->m_key).tag.len + lVar8);
    s_01.str = *(char **)((long)&(pNVar2->m_key).tag.str + lVar8);
    bVar7 = in_arena(this,s_01);
    if (bVar7) {
      s_02.len = *(size_t *)((long)&(pNVar2->m_key).tag.len + lVar8);
      s_02.str = *(char **)((long)&(pNVar2->m_key).tag.str + lVar8);
      sVar10 = _relocated(this,s_02,next_arena);
      *(char **)((long)&(pNVar2->m_key).tag.str + lVar8) = sVar10.str;
      *(size_t *)((long)&(pNVar2->m_key).tag.len + lVar8) = sVar10.len;
    }
    s_03.len = *(size_t *)((long)&(pNVar2->m_key).anchor.len + lVar8);
    s_03.str = *(char **)((long)&(pNVar2->m_key).anchor.str + lVar8);
    bVar7 = in_arena(this,s_03);
    if (bVar7) {
      s_04.len = *(size_t *)((long)&(pNVar2->m_key).anchor.len + lVar8);
      s_04.str = *(char **)((long)&(pNVar2->m_key).anchor.str + lVar8);
      sVar10 = _relocated(this,s_04,next_arena);
      *(char **)((long)&(pNVar2->m_key).anchor.str + lVar8) = sVar10.str;
      *(size_t *)((long)&(pNVar2->m_key).anchor.len + lVar8) = sVar10.len;
    }
    s_05.len = *(size_t *)((long)&(pNVar2->m_val).scalar.len + lVar8);
    s_05.str = *(char **)((long)&(pNVar2->m_val).scalar.str + lVar8);
    bVar7 = in_arena(this,s_05);
    if (bVar7) {
      s_06.len = *(size_t *)((long)&(pNVar2->m_val).scalar.len + lVar8);
      s_06.str = *(char **)((long)&(pNVar2->m_val).scalar.str + lVar8);
      sVar10 = _relocated(this,s_06,next_arena);
      *(char **)((long)&(pNVar2->m_val).scalar.str + lVar8) = sVar10.str;
      *(size_t *)((long)&(pNVar2->m_val).scalar.len + lVar8) = sVar10.len;
    }
    s_07.len = *(size_t *)((long)&(pNVar2->m_val).tag.len + lVar8);
    s_07.str = *(char **)((long)&(pNVar2->m_val).tag.str + lVar8);
    bVar7 = in_arena(this,s_07);
    if (bVar7) {
      s_08.len = *(size_t *)((long)&(pNVar2->m_val).tag.len + lVar8);
      s_08.str = *(char **)((long)&(pNVar2->m_val).tag.str + lVar8);
      sVar10 = _relocated(this,s_08,next_arena);
      *(char **)((long)&(pNVar2->m_val).tag.str + lVar8) = sVar10.str;
      *(size_t *)((long)&(pNVar2->m_val).tag.len + lVar8) = sVar10.len;
    }
    s_09.len = *(size_t *)((long)&(pNVar2->m_val).anchor.len + lVar8);
    s_09.str = *(char **)((long)&(pNVar2->m_val).anchor.str + lVar8);
    bVar7 = in_arena(this,s_09);
    if (bVar7) {
      s_10.len = *(size_t *)((long)&(pNVar2->m_val).anchor.len + lVar8);
      s_10.str = *(char **)((long)&(pNVar2->m_val).anchor.str + lVar8);
      sVar10 = _relocated(this,s_10,next_arena);
      *(char **)((long)&(pNVar2->m_val).anchor.str + lVar8) = sVar10.str;
      *(size_t *)((long)&(pNVar2->m_val).anchor.len + lVar8) = sVar10.len;
    }
  }
  for (lVar8 = 0x78; lVar8 != 0x118; lVar8 = lVar8 + 0x28) {
    cVar9.len = *(size_t *)((long)this->m_tag_directives + lVar8 + -0x60);
    cVar9.str = *(char **)((long)this->m_tag_directives + lVar8 + -0x68);
    bVar7 = in_arena(this,cVar9);
    if (bVar7) {
      s_11.len = *(size_t *)((long)this->m_tag_directives + lVar8 + -0x60);
      s_11.str = *(char **)((long)this->m_tag_directives + lVar8 + -0x68);
      sVar10 = _relocated(this,s_11,next_arena);
      *(char **)((long)this->m_tag_directives + lVar8 + -0x68) = sVar10.str;
      *(size_t *)((long)this->m_tag_directives + lVar8 + -0x60) = sVar10.len;
    }
    s_12.len = *(size_t *)((long)this->m_tag_directives + lVar8 + -0x70);
    s_12.str = *(char **)((long)(this->m_tag_directives + -3) + lVar8);
    bVar7 = in_arena(this,s_12);
    if (bVar7) {
      s_13.len = *(size_t *)((long)this->m_tag_directives + lVar8 + -0x70);
      s_13.str = *(char **)((long)(this->m_tag_directives + -3) + lVar8);
      sVar10 = _relocated(this,s_13,next_arena);
      *(char **)((long)(this->m_tag_directives + -3) + lVar8) = sVar10.str;
      *(size_t *)((long)this->m_tag_directives + lVar8 + -0x70) = sVar10.len;
    }
  }
  return;
}

Assistant:

void Tree::_relocate(substr next_arena)
{
    _RYML_CB_ASSERT(m_callbacks, next_arena.not_empty());
    _RYML_CB_ASSERT(m_callbacks, next_arena.len >= m_arena.len);
    memcpy(next_arena.str, m_arena.str, m_arena_pos);
    for(NodeData *C4_RESTRICT n = m_buf, *e = m_buf + m_cap; n != e; ++n)
    {
        if(in_arena(n->m_key.scalar))
            n->m_key.scalar = _relocated(n->m_key.scalar, next_arena);
        if(in_arena(n->m_key.tag))
            n->m_key.tag = _relocated(n->m_key.tag, next_arena);
        if(in_arena(n->m_key.anchor))
            n->m_key.anchor = _relocated(n->m_key.anchor, next_arena);
        if(in_arena(n->m_val.scalar))
            n->m_val.scalar = _relocated(n->m_val.scalar, next_arena);
        if(in_arena(n->m_val.tag))
            n->m_val.tag = _relocated(n->m_val.tag, next_arena);
        if(in_arena(n->m_val.anchor))
            n->m_val.anchor = _relocated(n->m_val.anchor, next_arena);
    }
    for(TagDirective &C4_RESTRICT td : m_tag_directives)
    {
        if(in_arena(td.prefix))
            td.prefix = _relocated(td.prefix, next_arena);
        if(in_arena(td.handle))
            td.handle = _relocated(td.handle, next_arena);
    }
}